

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_divu_i64_mips(TCGContext_conflict3 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGv_i64 ret_00;
  TCGOp *pTVar1;
  uintptr_t o;
  uintptr_t o_1;
  TCGTemp *ts;
  uintptr_t o_2;
  
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_movi_i64_mips(tcg_ctx,ret_00,0);
  ts = (TCGTemp *)(ret_00 + (long)tcg_ctx);
  pTVar1 = tcg_emit_op_mips(tcg_ctx,INDEX_op_divu2_i64);
  pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)ts;
  pTVar1->args[2] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)ts;
  pTVar1->args[4] = (TCGArg)(arg2 + (long)tcg_ctx);
  tcg_temp_free_internal_mips(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_divu_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_HAS_div_i64
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_divu_i64, ret, arg1, arg2);
#elif TCG_TARGET_HAS_div2_i64
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_movi_i64(tcg_ctx, t0, 0);
        tcg_gen_op5_i64(tcg_ctx, INDEX_op_divu2_i64, ret, t0, arg1, t0, arg2);
        tcg_temp_free_i64(tcg_ctx, t0);
#else
        gen_helper_divu_i64(tcg_ctx, ret, arg1, arg2);
#endif
}